

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O1

void ralloc_steal(void *new_ctx,void *ptr)

{
  ralloc_header *info;
  long lVar1;
  long lVar2;
  
  if (ptr != (void *)0x0) {
    if (*(int *)((long)ptr + -0x30) != 0x5a1106) {
LAB_001f8538:
      __assert_fail("info->canary == CANARY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                    ,0x5f,"ralloc_header *get_header(const void *)");
    }
    if (new_ctx == (void *)0x0) {
      lVar2 = 0;
    }
    else {
      if (*(int *)((long)new_ctx + -0x30) != 0x5a1106) goto LAB_001f8538;
      lVar2 = (long)new_ctx + -0x30;
    }
    info = (ralloc_header *)((long)ptr + -0x30);
    unlink_block(info);
    if (lVar2 != 0) {
      *(long *)((long)ptr + -0x28) = lVar2;
      lVar1 = *(long *)(lVar2 + 0x10);
      *(long *)((long)ptr + -0x10) = lVar1;
      *(ralloc_header **)(lVar2 + 0x10) = info;
      if (lVar1 != 0) {
        *(ralloc_header **)(lVar1 + 0x18) = info;
      }
    }
  }
  return;
}

Assistant:

void
ralloc_steal(const void *new_ctx, void *ptr)
{
   ralloc_header *info, *parent;

   if (unlikely(ptr == NULL))
      return;

   info = get_header(ptr);
   parent = new_ctx ? get_header(new_ctx) : NULL;

   unlink_block(info);

   add_child(parent, info);
}